

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

yrmcds_error connect_to_server(char *node,uint16_t port,int *server_fd)

{
  bool bVar1;
  int __fd;
  int iVar2;
  uint uVar3;
  int *piVar4;
  yrmcds_error yVar5;
  int e;
  addrinfo *res;
  int ok;
  socklen_t l;
  char sport [8];
  addrinfo hint;
  int local_7c;
  addrinfo *local_78;
  pollfd local_6c;
  socklen_t local_64;
  char local_60 [8];
  addrinfo local_58;
  
  if (node == (char *)0x0) {
    return YRMCDS_BAD_ARGUMENT;
  }
  snprintf(local_60,8,"%u",port);
  local_58.ai_protocol = 0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_family = 2;
  local_58.ai_socktype = 1;
  local_58.ai_flags = 0x420;
  local_7c = getaddrinfo(node,local_60,&local_58,&local_78);
  if ((local_7c + 9U < 8) && ((0x99U >> (local_7c + 9U & 0x1f) & 1) != 0)) {
    local_58.ai_flags = 0x408;
    local_58.ai_family = 10;
    local_7c = getaddrinfo(node,local_60,&local_58,&local_78);
  }
  if (local_7c == -0xb) {
    return YRMCDS_SYSTEM_ERROR;
  }
  if (local_7c != 0) {
    return YRMCDS_NOT_RESOLVED;
  }
  __fd = socket(local_78->ai_family,local_78->ai_socktype | 0x80800,local_78->ai_protocol);
  if (__fd == -1) {
    piVar4 = __errno_location();
    local_7c = *piVar4;
    freeaddrinfo(local_78);
    goto LAB_00122054;
  }
  local_7c = connect(__fd,local_78->ai_addr,local_78->ai_addrlen);
  freeaddrinfo(local_78);
  if (local_7c != 0) {
    if (local_7c == -1) {
      piVar4 = __errno_location();
      if (*piVar4 != 0x73) {
        local_7c = *piVar4;
        close(__fd);
        *piVar4 = local_7c;
        return YRMCDS_SYSTEM_ERROR;
      }
    }
    local_6c.events = 4;
    local_6c.fd = __fd;
    iVar2 = poll(&local_6c,1,5000);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      local_7c = *piVar4;
      close(__fd);
      *piVar4 = local_7c;
      yVar5 = YRMCDS_SYSTEM_ERROR;
LAB_00121fd6:
      bVar1 = false;
    }
    else {
      if (iVar2 == 0) {
        close(__fd);
        yVar5 = YRMCDS_TIMEOUT;
        goto LAB_00121fd6;
      }
      if (((byte)local_6c.revents & 0x38) != 0) {
        close(__fd);
        yVar5 = YRMCDS_DISCONNECTED;
        goto LAB_00121fd6;
      }
      local_64 = 4;
      iVar2 = getsockopt(__fd,1,4,&local_7c,&local_64);
      if (iVar2 == -1) {
        close(__fd);
LAB_001220d6:
        bVar1 = false;
      }
      else {
        if (local_7c != 0) {
          close(__fd);
          iVar2 = local_7c;
          piVar4 = __errno_location();
          *piVar4 = iVar2;
          goto LAB_001220d6;
        }
        bVar1 = true;
      }
      yVar5 = YRMCDS_SYSTEM_ERROR;
    }
    if (!bVar1) {
      return yVar5;
    }
  }
  uVar3 = fcntl(__fd,3,0);
  iVar2 = fcntl(__fd,4,(long)(int)(uVar3 & 0xfffff7ff));
  if (iVar2 != -1) {
    local_6c.fd = 1;
    iVar2 = setsockopt(__fd,6,1,&local_6c,4);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      local_7c = *piVar4;
      close(__fd);
      *piVar4 = local_7c;
      return YRMCDS_SYSTEM_ERROR;
    }
    *server_fd = __fd;
    return YRMCDS_OK;
  }
  piVar4 = __errno_location();
  local_7c = *piVar4;
  close(__fd);
LAB_00122054:
  *piVar4 = local_7c;
  return YRMCDS_SYSTEM_ERROR;
}

Assistant:

static yrmcds_error connect_to_server(const char* node, uint16_t port, int* server_fd) {
    if( node == NULL )
        return YRMCDS_BAD_ARGUMENT;

    long fl;
    char sport[8];
    snprintf(sport, sizeof(sport), "%u", (unsigned int)port);

    struct addrinfo hint, *res;
    memset(&hint, 0, sizeof(hint));
    hint.ai_family = AF_INET;  // prefer IPv4
    hint.ai_socktype = SOCK_STREAM;
    hint.ai_flags = AI_NUMERICSERV|AI_ADDRCONFIG;
    int e = getaddrinfo(node, sport, &hint, &res);
    if( e == EAI_FAMILY || e == EAI_NONAME
#ifdef EAI_ADDRFAMILY
        || e == EAI_ADDRFAMILY
#endif
#ifdef EAI_NODATA
        || e == EAI_NODATA
#endif
        ) {
        hint.ai_family = AF_INET6;
        // intentionally drop AI_ADDRCONFIG to support IPv6 link-local address.
        // see https://github.com/cybozu/yrmcds/issues/40
        hint.ai_flags = AI_NUMERICSERV|AI_V4MAPPED;
        e = getaddrinfo(node, sport, &hint, &res);
    }
    if( e == EAI_SYSTEM ) {
        return YRMCDS_SYSTEM_ERROR;
    } else if( e != 0 ) {
        return YRMCDS_NOT_RESOLVED;
    }

    int s = socket(res->ai_family,
                   res->ai_socktype
#ifdef __linux__
                   | SOCK_NONBLOCK | SOCK_CLOEXEC
#endif
                   , res->ai_protocol);
    if( s == -1 ) {
        e = errno;
        freeaddrinfo(res);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
#ifndef __linux__
    fl = fcntl(s, F_GETFD, 0);
    fcntl(s, F_SETFD, fl | FD_CLOEXEC);
    fl = fcntl(s, F_GETFL, 0);
    fcntl(s, F_SETFL, fl | O_NONBLOCK);
#endif
    e = connect(s, res->ai_addr, res->ai_addrlen);
    freeaddrinfo(res);
    if( e == -1 && errno != EINPROGRESS ) {
        e = errno;
        close(s);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }

    if( e != 0 ) {
        struct pollfd fds;
        fds.fd = s;
        fds.events = POLLOUT;
        int n = poll(&fds, 1, 5000);
        if( n == 0 ) { // timeout
            close(s);
            return YRMCDS_TIMEOUT;
        }
        if( n == -1 ) {
            e = errno;
            close(s);
            errno = e;
            return YRMCDS_SYSTEM_ERROR;
        }

        if( fds.revents & (POLLERR|POLLHUP|POLLNVAL) ) {
            close(s);
            return YRMCDS_DISCONNECTED;
        }
        socklen_t l = sizeof(e);
        if( getsockopt(s, SOL_SOCKET, SO_ERROR, &e, &l) == -1 ) {
            close(s);
            return YRMCDS_SYSTEM_ERROR;
        }
        if( e != 0 ) {
            close(s);
            errno = e;
            return YRMCDS_SYSTEM_ERROR;
        }
    }
    fl = fcntl(s, F_GETFL, 0);
    if( fcntl(s, F_SETFL, fl & ~O_NONBLOCK) == -1 ) {
        e = errno;
        close(s);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
    int ok = 1;
    if( setsockopt(s, IPPROTO_TCP, TCP_NODELAY, &ok, sizeof(ok)) == -1 ) {
        e = errno;
        close(s);
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
    *server_fd = s;
    return YRMCDS_OK;
}